

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi__check_png_header(stbi__context *s)

{
  stbi_uc sVar1;
  int iVar2;
  int local_1c;
  int i;
  stbi__context *s_local;
  
  local_1c = 0;
  while( true ) {
    if (7 < local_1c) {
      return 1;
    }
    sVar1 = stbi__get8(s);
    if (sVar1 != stbi__check_png_header::png_sig[local_1c]) break;
    local_1c = local_1c + 1;
  }
  iVar2 = stbi__err("bad png sig");
  return iVar2;
}

Assistant:

static int stbi__check_png_header(stbi__context *s)
{
   static const stbi_uc png_sig[8] = { 137,80,78,71,13,10,26,10 };
   int i;
   for (i=0; i < 8; ++i)
      if (stbi__get8(s) != png_sig[i]) return stbi__err("bad png sig","Not a PNG");
   return 1;
}